

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_cord_state.h
# Opt level: O0

Rep * __thiscall absl::crc_internal::CrcCordState::mutable_rep(CrcCordState *this)

{
  RefcountedRep *pRVar1;
  RefcountedRep *copy;
  CrcCordState *this_local;
  memory_order __b;
  
  pRVar1 = this->refcounted_rep_;
  std::operator&(memory_order_acquire,__memory_order_mask);
  if ((pRVar1->count).super___atomic_base<int>._M_i != 1) {
    pRVar1 = (RefcountedRep *)operator_new(0x68);
    RefcountedRep::RefcountedRep(pRVar1);
    Rep::operator=(&pRVar1->rep,&this->refcounted_rep_->rep);
    Unref(this->refcounted_rep_);
    this->refcounted_rep_ = pRVar1;
  }
  return &this->refcounted_rep_->rep;
}

Assistant:

Rep* mutable_rep() {
    if (refcounted_rep_->count.load(std::memory_order_acquire) != 1) {
      RefcountedRep* copy = new RefcountedRep;
      copy->rep = refcounted_rep_->rep;
      Unref(refcounted_rep_);
      refcounted_rep_ = copy;
    }
    return &refcounted_rep_->rep;
  }